

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void __thiscall
HighsHashTree<int,_int>::InnerLeaf<4>::move_backward(InnerLeaf<4> *this,int *first,int *last)

{
  difference_type __d;
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = *first;
  lVar1 = (long)iVar3;
  iVar2 = *last;
  if (iVar2 != iVar3) {
    lVar4 = iVar2 - lVar1;
    memmove((void *)((long)this + lVar4 * -8 + (long)iVar2 * 8 + 0x1d0),
            (this->entries)._M_elems + lVar1,lVar4 * 8);
    iVar3 = *first;
    iVar2 = *last;
    lVar1 = (long)iVar3;
  }
  memmove((this->hashes)._M_elems + (long)iVar3 + 1,(this->hashes)._M_elems + lVar1,
          (long)(iVar2 - iVar3) << 3);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }